

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

char * glslang::TQualifier::getInterlockOrderingString(TInterlockOrdering order)

{
  char *pcStack_10;
  TInterlockOrdering order_local;
  
  switch(order) {
  case EioPixelInterlockOrdered:
    pcStack_10 = "pixel_interlock_ordered";
    break;
  case EioPixelInterlockUnordered:
    pcStack_10 = "pixel_interlock_unordered";
    break;
  case EioSampleInterlockOrdered:
    pcStack_10 = "sample_interlock_ordered";
    break;
  case EioSampleInterlockUnordered:
    pcStack_10 = "sample_interlock_unordered";
    break;
  case EioShadingRateInterlockOrdered:
    pcStack_10 = "shading_rate_interlock_ordered";
    break;
  case EioShadingRateInterlockUnordered:
    pcStack_10 = "shading_rate_interlock_unordered";
    break;
  default:
    pcStack_10 = "none";
  }
  return pcStack_10;
}

Assistant:

static const char* getInterlockOrderingString(TInterlockOrdering order)
    {
        switch (order) {
        case EioPixelInterlockOrdered:          return "pixel_interlock_ordered";
        case EioPixelInterlockUnordered:        return "pixel_interlock_unordered";
        case EioSampleInterlockOrdered:         return "sample_interlock_ordered";
        case EioSampleInterlockUnordered:       return "sample_interlock_unordered";
        case EioShadingRateInterlockOrdered:    return "shading_rate_interlock_ordered";
        case EioShadingRateInterlockUnordered:  return "shading_rate_interlock_unordered";
        default:                                return "none";
        }
    }